

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

void sysbvm_functionDefinition_ensureTypeAnalysis
               (sysbvm_context_t *context,sysbvm_functionDefinition_t **functionDefinition)

{
  _Bool _Var1;
  sysbvm_functionSourceDefinition_t *sourceDefinition;
  sysbvm_functionDefinition_t **functionDefinition_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isKindOf
                    (context,(sysbvm_tuple_t)*functionDefinition,
                     (context->roots).functionDefinitionType);
  if ((((_Var1) && (*(long *)((*functionDefinition)->sourceDefinition + 0x20) != 0)) &&
      (*(long *)((*functionDefinition)->sourceDefinition + 0x30) != 0)) &&
     ((*functionDefinition)->type == 0)) {
    sysbvm_functionDefinition_analyzeType(context,functionDefinition);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionDefinition_ensureTypeAnalysis(sysbvm_context_t *context, sysbvm_functionDefinition_t **functionDefinition)
{
    // Make sure this is a valid function definition for analysis.
    if(!sysbvm_tuple_isKindOf(context, (sysbvm_tuple_t)*functionDefinition, context->roots.functionDefinitionType))
        return;

    sysbvm_functionSourceDefinition_t *sourceDefinition = (sysbvm_functionSourceDefinition_t *)(*functionDefinition)->sourceDefinition;
    if(!sourceDefinition->argumentNodes || !sourceDefinition->bodyNode)
        return;

    // Is it already analyzed?
    if((*functionDefinition)->type)
        return;

    sysbvm_functionDefinition_analyzeType(context, functionDefinition);
}